

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkBitwiseParenBool(CheckerVisitor *this,BinExpr *expr)

{
  TreeOp TVar1;
  
  if (((this->effectsOnly == false) && ((expr->super_Expr).super_Node._op - TO_OROR < 2)) &&
     ((TVar1 = (expr->_lhs->super_Node)._op, TVar1 == TO_OR ||
      (((TVar1 == TO_AND || (TVar1 = (expr->_rhs->super_Node)._op, TVar1 == TO_AND)) ||
       (TVar1 == TO_OR)))))) {
    report(this,(Node *)expr,0x3b);
    return;
  }
  return;
}

Assistant:

void CheckerVisitor::checkBitwiseParenBool(const BinExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *l = expr->lhs();
  const Expr *r = expr->rhs();

  if (expr->op() == TO_OROR || expr->op() == TO_ANDAND) {
    if (l->op() == TO_AND || l->op() == TO_OR || r->op() == TO_AND || r->op() == TO_OR) {
      report(expr, DiagnosticsId::DI_BITWISE_BOOL_PAREN);
    }
  }
}